

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlChar * xmlXPathCastNumberToString(double val)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  xmlChar *pxVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  double dVar10;
  char work [30];
  char buf [100];
  char local_a8 [32];
  double local_88;
  undefined8 local_78;
  ushort local_70;
  undefined1 local_46;
  undefined1 local_15;
  
  iVar3 = ((0.0 < val) - 1) + (uint)(0.0 < val);
  if (ABS(val) != INFINITY) {
    iVar3 = 0;
  }
  if (iVar3 == -1) {
    pxVar5 = xmlStrdup((xmlChar *)"-Infinity");
    return pxVar5;
  }
  if (iVar3 == 1) {
    pxVar5 = xmlStrdup("Infinity");
    return pxVar5;
  }
  if (NAN(val)) {
    pxVar5 = xmlStrdup((xmlChar *)"NaN");
    return pxVar5;
  }
  if ((val == 0.0) && (!NAN(val))) {
    pxVar5 = xmlStrdup("0");
    return pxVar5;
  }
  if (iVar3 == -1) {
    local_78 = 0x74696e69666e492d;
    local_70 = 0x79;
  }
  else if (iVar3 == 1) {
    local_78 = 0x7974696e69666e49;
    local_70 = local_70 & 0xff00;
  }
  else {
    if ((-2147483648.0 < val) && (val < 2147483647.0)) {
      if (((double)(int)val == val) && (!NAN((double)(int)val) && !NAN(val))) {
        if ((int)val == 0) {
          pcVar6 = (char *)((long)&local_78 + 1);
          local_78 = CONCAT71(local_78._1_7_,0x30);
        }
        else {
          snprintf(local_a8,0x1d,"%d");
          pcVar6 = (char *)&local_78;
          if (local_a8[0] != '\0') {
            lVar9 = 1;
            do {
              *pcVar6 = local_a8[0];
              pcVar6 = pcVar6 + 1;
              local_a8[0] = local_a8[lVar9];
              if (local_a8[0] == '\0') break;
              bVar2 = lVar9 < 99;
              lVar9 = lVar9 + 1;
            } while (bVar2);
          }
        }
        pcVar6[-(ulong)(0x62 < (long)pcVar6 - (long)&local_78)] = '\0';
        goto LAB_001c1426;
      }
    }
    dVar10 = ABS(val);
    if ((1000000000.0 < dVar10) || (dVar10 < 1e-05)) {
      uVar4 = snprintf(local_a8,0x1c,"%*.*e",val,0x15,0xe);
      if (0 < (int)uVar4) {
        do {
          if (local_a8[uVar4] == 'e') goto joined_r0x001c1388;
          bVar2 = 1 < (int)uVar4;
          uVar4 = uVar4 - 1;
        } while (bVar2);
        uVar4 = 0;
      }
    }
    else {
      local_88 = val;
      dVar10 = log10(dVar10);
      uVar4 = snprintf(local_a8,0x1c,"%0.*f",local_88,(ulong)((0 < (int)dVar10 ^ 0xf) - (int)dVar10)
                      );
    }
joined_r0x001c1388:
    while (pcVar6 = local_a8, local_a8[0] == ' ') {
      do {
        cVar1 = pcVar6[1];
        *pcVar6 = cVar1;
        pcVar6 = pcVar6 + 1;
      } while (cVar1 != '\0');
      uVar4 = uVar4 - 1;
    }
    pcVar6 = local_a8 + (int)uVar4;
    do {
      pcVar8 = pcVar6;
      pcVar6 = pcVar8 + -1;
    } while (pcVar8[-1] == '0');
    if (pcVar8[-1] != '.') {
      pcVar6 = pcVar8;
    }
    lVar9 = 0;
    do {
      cVar1 = (local_a8 + (int)uVar4)[lVar9];
      pcVar6[lVar9] = cVar1;
      lVar9 = lVar9 + 1;
    } while (cVar1 != '\0');
    sVar7 = strlen(local_a8);
    iVar3 = (int)sVar7 + 1;
    if (99 < iVar3) {
      local_46 = 0;
      iVar3 = 99;
    }
    memcpy(&local_78,local_a8,(long)iVar3);
  }
LAB_001c1426:
  local_15 = 0;
  pxVar5 = xmlStrdup((xmlChar *)&local_78);
  return pxVar5;
}

Assistant:

xmlChar *
xmlXPathCastNumberToString (double val) {
    xmlChar *ret;
    switch (xmlXPathIsInf(val)) {
    case 1:
	ret = xmlStrdup((const xmlChar *) "Infinity");
	break;
    case -1:
	ret = xmlStrdup((const xmlChar *) "-Infinity");
	break;
    default:
	if (xmlXPathIsNaN(val)) {
	    ret = xmlStrdup((const xmlChar *) "NaN");
	} else if (val == 0) {
            /* Omit sign for negative zero. */
	    ret = xmlStrdup((const xmlChar *) "0");
	} else {
	    /* could be improved */
	    char buf[100];
	    xmlXPathFormatNumber(val, buf, 99);
	    buf[99] = 0;
	    ret = xmlStrdup((const xmlChar *) buf);
	}
    }
    return(ret);
}